

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O2

Element __thiscall ui::anon_unknown_1::PanelAdapter::Render(PanelAdapter *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar1;
  long in_RSI;
  Element EVar2;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l;
  allocator_type local_d9;
  Element local_d8;
  undefined1 local_c8 [40];
  shared_ptr<ftxui::Node> local_a0 [2];
  ftxui local_80 [16];
  Decorator local_70;
  Decorator local_50;
  
  (**(code **)(**(long **)(in_RSI + 0x28) + 0x10))(local_a0);
  EVar2 = ftxui::separator();
  (**(code **)(**(long **)(in_RSI + 0x38) + 0x10))
            (&local_d8,*(long **)(in_RSI + 0x38),
             EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _M_pi);
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object = ftxui::flex;
  local_50._M_invoker =
       std::
       _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
       ::_M_invoke;
  local_50.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
       ::_M_manager;
  ftxui::operator|(local_80,&local_d8,&local_50);
  __l._M_len = 3;
  __l._M_array = local_a0;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            ((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *
             )(local_c8 + 0x10),__l,&local_d9);
  ftxui::vbox((Elements *)local_c8);
  local_70.super__Function_base._M_functor._8_8_ = 0;
  local_70.super__Function_base._M_functor._M_unused._M_object = ftxui::flex;
  local_70._M_invoker =
       std::
       _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
       ::_M_invoke;
  local_70.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
       ::_M_manager;
  ftxui::operator|((ftxui *)this,(Element *)local_c8,&local_70);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            ((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *
             )(local_c8 + 0x10));
  lVar1 = 0x28;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_a0[0].super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -8);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() final {
    return vbox({
               title_->Render(),
               separator(),
               panel_->Render() | flex,
           }) |
           flex;
  }